

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O1

LogConfig * __thiscall
duckdb::LogManager::GetConfig(LogConfig *__return_storage_ptr__,LogManager *this)

{
  pointer pcVar1;
  size_t sVar2;
  LogMode LVar3;
  undefined4 uVar4;
  __alloc_node_gen_t __alloc_node_gen;
  unique_lock<std::mutex> lck;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  local_40;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &this->lock;
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  __return_storage_ptr__->level = (this->config).level;
  LVar3 = (this->config).mode;
  __return_storage_ptr__->enabled = (this->config).enabled;
  __return_storage_ptr__->mode = LVar3;
  (__return_storage_ptr__->storage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->storage).field_2;
  pcVar1 = (this->config).storage._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->storage,pcVar1,
             pcVar1 + (this->config).storage._M_string_length);
  local_40._M_h = (__hashtable_alloc *)&__return_storage_ptr__->enabled_log_types;
  (__return_storage_ptr__->enabled_log_types)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->enabled_log_types)._M_h._M_bucket_count =
       (this->config).enabled_log_types._M_h._M_bucket_count;
  (__return_storage_ptr__->enabled_log_types)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->enabled_log_types)._M_h._M_element_count =
       (this->config).enabled_log_types._M_h._M_element_count;
  uVar4 = *(undefined4 *)&(this->config).enabled_log_types._M_h._M_rehash_policy.field_0x4;
  sVar2 = (this->config).enabled_log_types._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->enabled_log_types)._M_h._M_rehash_policy._M_max_load_factor =
       (this->config).enabled_log_types._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->enabled_log_types)._M_h._M_rehash_policy.field_0x4 =
       uVar4;
  (__return_storage_ptr__->enabled_log_types)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (__return_storage_ptr__->enabled_log_types)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_40._M_h,&(this->config).enabled_log_types._M_h,&local_40);
  local_40._M_h = (__hashtable_alloc *)&__return_storage_ptr__->disabled_log_types;
  (__return_storage_ptr__->disabled_log_types)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->disabled_log_types)._M_h._M_bucket_count =
       (this->config).disabled_log_types._M_h._M_bucket_count;
  (__return_storage_ptr__->disabled_log_types)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->disabled_log_types)._M_h._M_element_count =
       (this->config).disabled_log_types._M_h._M_element_count;
  uVar4 = *(undefined4 *)&(this->config).disabled_log_types._M_h._M_rehash_policy.field_0x4;
  sVar2 = (this->config).disabled_log_types._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->disabled_log_types)._M_h._M_rehash_policy._M_max_load_factor =
       (this->config).disabled_log_types._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->disabled_log_types)._M_h._M_rehash_policy.field_0x4 =
       uVar4;
  (__return_storage_ptr__->disabled_log_types)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (__return_storage_ptr__->disabled_log_types)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_40._M_h,&(this->config).disabled_log_types._M_h,&local_40);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return __return_storage_ptr__;
}

Assistant:

LogConfig LogManager::GetConfig() {
	unique_lock<mutex> lck(lock);
	return config;
}